

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::tryPumpFrom
          (PromisedAsyncOutputStream *this,AsyncInputStream *input,uint64_t amount)

{
  AsyncOutputStream *pAVar1;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar2;
  Maybe<kj::Promise<unsigned_long>_> MVar3;
  Type local_48;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *s;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *_s2529;
  uint64_t amount_local;
  AsyncInputStream *input_local;
  PromisedAsyncOutputStream *this_local;
  
  _s2529 = in_RCX;
  amount_local = amount;
  input_local = input;
  this_local = this;
  local_48.amount =
       (uint64_t)
       kj::_::readMaybe<kj::AsyncOutputStream,decltype(nullptr)>
                 ((Maybe<kj::Own<kj::AsyncOutputStream,_std::nullptr_t>_> *)(input + 3));
  s = (Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48.amount;
  if ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48.amount ==
      (Own<kj::AsyncOutputStream,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_48);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromisedAsyncOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)&local_48.input,&local_48);
    Maybe<kj::Promise<unsigned_long>_>::Maybe
              ((Maybe<kj::Promise<unsigned_long>_> *)this,(Promise<unsigned_long> *)&local_48.input)
    ;
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_48.input);
    Promise<void>::~Promise((Promise<void> *)&local_48);
    aVar2 = extraout_RDX_00;
  }
  else {
    pAVar1 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48.amount);
    (*pAVar1->_vptr_AsyncOutputStream[2])(this,pAVar1,amount_local,_s2529);
    aVar2 = extraout_RDX;
  }
  MVar3.ptr.field_1 = aVar2;
  MVar3.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_SOME(s, stream) {
      return s->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }